

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::SetLogFilenameExtension(char *ext)

{
  LogDestination *this;
  int local_1c;
  int severity;
  MutexLock l;
  char *ext_local;
  
  l.mu_ = (Mutex *)ext;
  ::glog_internal_namespace_::MutexLock::MutexLock
            ((MutexLock *)&stack0xffffffffffffffe8,(Mutex *)log_mutex);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    this = log_destination(local_1c);
    anon_unknown_10::LogFileObject::SetExtension(&this->fileobject_,(char *)l.mu_);
  }
  ::glog_internal_namespace_::MutexLock::~MutexLock((MutexLock *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

inline void LogDestination::SetLogFilenameExtension(const char* ext) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&log_mutex);
  for ( int severity = 0; severity < NUM_SEVERITIES; ++severity ) {
    log_destination(severity)->fileobject_.SetExtension(ext);
  }
}